

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::merge
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          data_node_type *leaf,int key)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *__a;
  int *piVar4;
  size_type sVar5;
  reference pvVar6;
  int in_EDX;
  AlexNode<int,_int> *in_RSI;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RDI;
  bool bVar7;
  double dVar8;
  int i_1;
  int end_bucketID_1;
  int start_bucketID_1;
  bool is_root_node;
  int i;
  data_node_type *adjacent_leaf;
  bool adjacent_to_right;
  int end_bucketID;
  int start_bucketID;
  int repeats;
  int bucketID;
  model_node_type *parent;
  TraversalNode tn;
  int path_pos;
  data_node_type *leaf_dup;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  traversal_path;
  double tolerance;
  int bucketID_prediction_rounded;
  data_node_type *leaf_1;
  int bucketID_1;
  double bucketID_prediction;
  model_node_type *node;
  AlexNode<int,_int> *cur;
  value_type *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  AlexNode<int,_int> *this_00;
  int local_11c;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  uint in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  AlexNode<int,_int> *local_108;
  int local_f0;
  int local_ec;
  model_node_type *local_e8;
  int local_d8;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffff40;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  local_b0;
  int local_94;
  AlexNode<int,_int> *local_90;
  double local_80;
  int local_74;
  AlexNode<int,_int> *local_70;
  AlexNode<int,_int> *local_68;
  int local_60;
  int local_54 [3];
  double local_48;
  AlexNode<int,_int> *local_40;
  AlexNode<int,_int> *local_38;
  model_node_type *local_30;
  undefined4 local_28;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  *local_20;
  int local_14;
  AlexNode<int,_int> *local_8;
  
  local_94 = in_EDX;
  local_90 = in_RSI;
  std::
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  ::vector((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
            *)0x11fc08);
  local_14 = local_94;
  local_20 = &local_b0;
  if (local_20 !=
      (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
       *)0x0) {
    local_30 = in_RDI->superroot_;
    local_28 = 0;
    std::
    vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
    ::push_back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                in_stack_fffffffffffffea8);
  }
  local_38 = in_RDI->root_node_;
  bVar7 = SUB81((ulong)_local_d8 >> 0x38,0);
  local_8 = local_38;
  if ((local_38->is_leaf_ & 1U) != 0) goto LAB_0011ff70;
  do {
    local_40 = local_38;
    local_48 = LinearModel<int>::predict_double(&local_38->model_,local_14);
    local_54[2] = (int)local_48;
    local_54[1] = 0;
    __a = std::max<int>(local_54 + 2,local_54 + 1);
    local_54[0] = *(int *)&local_40[1].is_leaf_ + -1;
    piVar4 = std::min<int>(__a,local_54);
    iVar1 = (int)__a;
    local_54[2] = *piVar4;
    if (local_20 !=
        (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
         *)0x0) {
      iVar1 = (int)local_20;
      local_68 = local_40;
      local_60 = local_54[2];
      std::
      vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
      ::push_back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                   *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                  in_stack_fffffffffffffea8);
    }
    local_70 = *(AlexNode<int,_int> **)((long)local_40[1].model_.a_ + (long)local_54[2] * 8);
    local_38 = local_70;
  } while ((local_70->is_leaf_ & 1U) == 0);
  (in_RDI->stats_).num_node_lookups = (long)local_70->level_ + (in_RDI->stats_).num_node_lookups;
  local_74 = (int)(local_48 + 0.5);
  dVar8 = std::numeric_limits<double>::epsilon();
  local_80 = dVar8 * 10.0 * local_48;
  dVar8 = local_48 - (double)local_74;
  std::abs(iVar1);
  if (dVar8 <= local_80) {
    if (local_48 < (double)local_74) {
      if ((local_70[1].model_.a_ != 0.0) &&
         (iVar1 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                  ::first_key((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                               *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
         iVar1 <= local_14)) {
        if (local_20 !=
            (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
             *)0x0) {
          correct_traversal_path
                    (in_stack_ffffffffffffff40,
                     (data_node_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                     ,(vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                       *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),bVar7);
        }
        local_8 = (AlexNode<int,_int> *)local_70[1].model_.a_;
        goto LAB_0011ff70;
      }
    }
    else if ((local_70[1].model_.b_ != 0.0) &&
            (iVar1 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                     ::last_key((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                                 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
            local_14 <= iVar1)) {
      if (local_20 !=
          (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
           *)0x0) {
        correct_traversal_path
                  (in_stack_ffffffffffffff40,
                   (data_node_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                    *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),bVar7);
      }
      local_8 = (AlexNode<int,_int> *)local_70[1].model_.b_;
      goto LAB_0011ff70;
    }
  }
  local_8 = local_70;
LAB_0011ff70:
  this_00 = local_8;
  if (local_8 != local_90) {
    if ((AlexNode<int,_int> *)local_8[1].model_.b_ == local_90) {
      correct_traversal_path
                (in_stack_ffffffffffffff40,
                 (data_node_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                  *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),bVar7);
    }
    else {
      if ((AlexNode<int,_int> *)local_8[1].model_.a_ != local_90) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                      ,0x8ca,
                      "void alex::Alex<int, int>::merge(data_node_type *, T) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      correct_traversal_path
                (in_stack_ffffffffffffff40,
                 (data_node_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                  *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),bVar7);
    }
  }
  sVar5 = std::
          vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
          ::size(&local_b0);
  if (sVar5 != 1) {
    sVar5 = std::
            vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
            ::size(&local_b0);
    iVar1 = (int)sVar5 + -1;
    pvVar6 = std::
             vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
             ::operator[](&local_b0,(long)iVar1);
    local_e8 = pvVar6->node;
    local_d8 = (int)*(undefined8 *)&pvVar6->bucketID;
    local_ec = local_d8;
    local_f0 = 1 << (local_90->duplication_factor_ & 0x1f);
    while (-1 < iVar1) {
      while( true ) {
        bVar7 = false;
        if (*(int *)&local_90[2].field_0xc == 0) {
          bVar7 = local_f0 < local_e8->num_children_;
        }
        if (!bVar7) break;
        iVar2 = local_ec - local_ec % local_f0;
        iVar3 = iVar2 + local_f0;
        bVar7 = local_ec % (local_f0 << 1) == local_ec % local_f0;
        if ((bVar7) && ((local_e8->children_[iVar3]->is_leaf_ & 1U) != 0)) {
          local_108 = local_e8->children_[iVar3];
        }
        else {
          if ((bVar7) || ((local_e8->children_[iVar2 + -1]->is_leaf_ & 1U) == 0)) break;
          local_108 = local_e8->children_[iVar2 + -1];
        }
        if (local_90->duplication_factor_ != local_108->duplication_factor_) break;
        while (in_stack_fffffffffffffef4 = iVar2, in_stack_fffffffffffffef4 < iVar3) {
          local_e8->children_[in_stack_fffffffffffffef4] = local_108;
          iVar2 = in_stack_fffffffffffffef4 + 1;
        }
        if (bVar7) {
          local_108[1].model_.b_ = local_90[1].model_.b_;
          if (local_90[1].model_.b_ != 0.0) {
            *(AlexNode<int,_int> **)((long)local_90[1].model_.b_ + 0x38) = local_108;
          }
        }
        else {
          local_108[1].model_.a_ = local_90[1].model_.a_;
          if (local_90[1].model_.a_ != 0.0) {
            *(AlexNode<int,_int> **)((long)local_90[1].model_.a_ + 0x40) = local_108;
          }
        }
        local_108->duplication_factor_ = local_108->duplication_factor_ + '\x01';
        delete_node((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *
                    )CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                    (AlexNode<int,_int> *)
                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        (in_RDI->stats_).num_data_nodes = (in_RDI->stats_).num_data_nodes + -1;
        local_90 = local_108;
        local_f0 = 1 << (local_108->duplication_factor_ & 0x1f);
      }
      if (local_f0 != local_e8->num_children_) break;
      local_90->duplication_factor_ = (local_e8->super_AlexNode<int,_int>).duplication_factor_;
      local_f0 = 1 << (local_90->duplication_factor_ & 0x1f);
      in_stack_fffffffffffffef0 =
           CONCAT13(local_e8 == (model_node_type *)in_RDI->root_node_,
                    (int3)in_stack_fffffffffffffef0);
      delete_node((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  (AlexNode<int,_int> *)
                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      (in_RDI->stats_).num_model_nodes = (in_RDI->stats_).num_model_nodes + -1;
      if ((in_stack_fffffffffffffef0 & 0x1000000) != 0) {
        in_RDI->root_node_ = local_90;
        update_superroot_pointer(in_RDI);
        break;
      }
      iVar1 = iVar1 + -1;
      pvVar6 = std::
               vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
               ::operator[](&local_b0,(long)iVar1);
      local_e8 = pvVar6->node;
      local_ec = pvVar6->bucketID;
      in_stack_fffffffffffffeec = local_ec - local_ec % local_f0;
      in_stack_fffffffffffffee8 = in_stack_fffffffffffffeec + local_f0;
      for (local_11c = in_stack_fffffffffffffeec; local_11c < in_stack_fffffffffffffee8;
          local_11c = local_11c + 1) {
        local_e8->children_[local_11c] = local_90;
      }
    }
  }
  std::
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  ::~vector((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
             *)this_00);
  return;
}

Assistant:

void merge(data_node_type* leaf, T key) {
    // first save the complete path down to data node
    std::vector<TraversalNode> traversal_path;
    auto leaf_dup = get_leaf(key, &traversal_path);
    // We might need to correct the traversal path in edge cases
    if (leaf_dup != leaf) {
      if (leaf_dup->prev_leaf_ == leaf) {
        correct_traversal_path(leaf, traversal_path, true);
      } else if (leaf_dup->next_leaf_ == leaf) {
        correct_traversal_path(leaf, traversal_path, false);
      } else {
        assert(false);
        return;
      }
    }
    if (traversal_path.size() == 1) {
      return;
    }
    int path_pos = static_cast<int>(traversal_path.size()) - 1;
    TraversalNode tn = traversal_path[path_pos];
    model_node_type* parent = tn.node;
    int bucketID = tn.bucketID;
    int repeats = 1 << leaf->duplication_factor_;

    while (path_pos >= 0) {
      // repeatedly merge leaf with "sibling" leaf by redirecting pointers in
      // the parent
      while (leaf->num_keys_ == 0 && repeats < parent->num_children_) {
        int start_bucketID = bucketID - (bucketID % repeats);
        int end_bucketID = start_bucketID + repeats;
        // determine if the potential sibling leaf is adjacent to the right or
        // left
        bool adjacent_to_right =
            (bucketID % (repeats << 1) == bucketID % repeats);
        data_node_type* adjacent_leaf = nullptr;

        // check if adjacent node is a leaf
        if (adjacent_to_right && parent->children_[end_bucketID]->is_leaf_) {
          adjacent_leaf =
              static_cast<data_node_type*>(parent->children_[end_bucketID]);
        } else if (!adjacent_to_right &&
                   parent->children_[start_bucketID - 1]->is_leaf_) {
          adjacent_leaf = static_cast<data_node_type*>(
              parent->children_[start_bucketID - 1]);
        } else {
          break;  // unable to merge with sibling leaf
        }

        // check if adjacent node is a sibling
        if (leaf->duplication_factor_ != adjacent_leaf->duplication_factor_) {
          break;  // unable to merge with sibling leaf
        }

        // merge with adjacent leaf
        for (int i = start_bucketID; i < end_bucketID; i++) {
          parent->children_[i] = adjacent_leaf;
        }
        if (adjacent_to_right) {
          adjacent_leaf->prev_leaf_ = leaf->prev_leaf_;
          if (leaf->prev_leaf_) {
            leaf->prev_leaf_->next_leaf_ = adjacent_leaf;
          }
        } else {
          adjacent_leaf->next_leaf_ = leaf->next_leaf_;
          if (leaf->next_leaf_) {
            leaf->next_leaf_->prev_leaf_ = adjacent_leaf;
          }
        }
        adjacent_leaf->duplication_factor_++;
        delete_node(leaf);
        stats_.num_data_nodes--;
        leaf = adjacent_leaf;
        repeats = 1 << leaf->duplication_factor_;
      }

      // try to merge up by removing parent and replacing pointers to parent
      // with pointers to leaf in grandparent
      if (repeats == parent->num_children_) {
        leaf->duplication_factor_ = parent->duplication_factor_;
        repeats = 1 << leaf->duplication_factor_;
        bool is_root_node = (parent == root_node_);
        delete_node(parent);
        stats_.num_model_nodes--;

        if (is_root_node) {
          root_node_ = leaf;
          update_superroot_pointer();
          break;
        }

        path_pos--;
        tn = traversal_path[path_pos];
        parent = tn.node;
        bucketID = tn.bucketID;
        int start_bucketID = bucketID - (bucketID % repeats);
        int end_bucketID = start_bucketID + repeats;
        for (int i = start_bucketID; i < end_bucketID; i++) {
          parent->children_[i] = leaf;
        }
      } else {
        break;  // unable to merge up
      }
    }
  }